

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefifind.cpp
# Opt level: O3

USTATUS __thiscall
UEFIFind::findFileRecursive
          (UEFIFind *this,UModelIndex index,CBString *hexPattern,UINT8 mode,
          set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
          *files)

{
  undefined1 *puVar1;
  UModelIndex index_00;
  UByteArray *pUVar2;
  undefined8 uVar3;
  bool bVar4;
  UINT8 UVar5;
  int iVar6;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  INTN IVar9;
  long lVar10;
  long lVar11;
  int i;
  int __c;
  USTATUS UVar12;
  UModelIndex parentFile;
  UByteArray data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> patternMask;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pattern;
  undefined1 local_118 [32];
  uint64_t uStack_f8;
  TreeModel *pTStack_f0;
  UByteArray local_e8;
  UINT8 *local_c8;
  undefined8 local_c0;
  UINT8 local_b8 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  UByteArray local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  TreeModel local_48;
  TreeModel *local_38;
  
  if (index.r < 0) {
    return 0;
  }
  if (index.c < 0) {
    return 0;
  }
  if (index.m == (TreeModel *)0x0) {
    return 0;
  }
  if ((hexPattern->super_tagbstring).slen == 0) {
    return 1;
  }
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (UINT8 *)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (UINT8 *)0x0;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (UINT8 *)0x0;
  bVar4 = makePattern((CHAR8 *)(hexPattern->super_tagbstring).data,&local_68,&local_a8);
  UVar12 = 1;
  if (!bVar4) goto LAB_0010c191;
  lVar10 = 0;
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar11 = 0;
    do {
      lVar10 = lVar10 + (ulong)(local_a8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar11] == '\0');
      lVar11 = lVar11 + 1;
    } while ((long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != lVar11);
  }
  if (lVar10 != (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
    iVar6 = TreeModel::rowCount(this->model,&index);
    for (__c = 0; iVar7 = TreeModel::rowCount(this->model,&index), __c < iVar7; __c = __c + 1) {
      TreeModel::index(&local_48,(char *)index.m,__c);
      index_00.i._0_1_ = local_48.markingEnabledFlag;
      index_00.i._1_1_ = local_48.markingDarkModeFlag;
      index_00.i._2_6_ = local_48._10_6_;
      index_00._0_8_ = local_48.rootItem;
      index_00.m = local_38;
      findFileRecursive(this,index_00,hexPattern,mode,files);
    }
    local_c0 = 0;
    local_b8[0] = '\0';
    local_c8 = local_b8;
    if (iVar6 < 1) {
      if (mode == '\x02') {
        TreeModel::body((UByteArray *)local_118,this->model,&index);
        std::__cxx11::string::_M_assign((string *)&local_c8);
      }
      else {
        if (mode != '\x01') {
          TreeModel::header(&local_e8,this->model,&index);
          TreeModel::body(&local_88,this->model,&index);
          operator+((UByteArray *)local_118,&local_e8,&local_88);
          std::__cxx11::string::_M_assign((string *)&local_c8);
          goto LAB_0010bfcf;
        }
        TreeModel::header((UByteArray *)local_118,this->model,&index);
        std::__cxx11::string::_M_assign((string *)&local_c8);
      }
LAB_0010bf73:
      pUVar2 = (UByteArray *)local_118;
LAB_0010bffd:
      paVar8 = &(pUVar2->d).field_2;
      puVar1 = (undefined1 *)(&paVar8->_M_allocated_capacity)[-2];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1 != paVar8) {
        operator_delete(puVar1);
      }
    }
    else {
      if (mode == '\x03') {
        TreeModel::header(&local_e8,this->model,&index);
        TreeModel::body(&local_88,this->model,&index);
        operator+((UByteArray *)local_118,&local_e8,&local_88);
        std::__cxx11::string::_M_assign((string *)&local_c8);
LAB_0010bfcf:
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.d._M_dataplus._M_p != &local_88.d.field_2) {
          operator_delete(local_88.d._M_dataplus._M_p);
        }
        pUVar2 = &local_e8;
        goto LAB_0010bffd;
      }
      if (mode == '\x01') {
        TreeModel::header((UByteArray *)local_118,this->model,&index);
        std::__cxx11::string::_M_assign((string *)&local_c8);
        goto LAB_0010bf73;
      }
    }
    IVar9 = findPattern(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,local_c8,(long)(int)local_c0,
                        0);
    if (mode == '\x03' && 0 < iVar6) {
      TreeModel::header((UByteArray *)local_118,this->model,&index);
      uVar3 = local_118._8_8_;
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_);
      }
      if ((-1 < IVar9) && (IVar9 < (int)uVar3)) {
LAB_0010c09b:
        UVar5 = TreeModel::type(this->model,&index);
        if (UVar5 == 'B') {
          uStack_f8 = 0;
          pTStack_f0 = (TreeModel *)0x0;
          local_118._0_8_ = CONCAT44(index.c,index.r);
          local_118._8_8_ = index.i;
          local_118._16_8_ = index.m;
          local_118._24_8_ = 0xffffffffffffffff;
          std::
          _Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
          ::_M_insert_unique<std::pair<UModelIndex,UModelIndex>>
                    ((_Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
                      *)files,(pair<UModelIndex,_UModelIndex> *)local_118);
        }
        else {
          TreeModel::findParentOfType((UModelIndex *)&local_e8,this->model,&index,'B');
          UVar5 = TreeModel::type(this->model,&index);
          if ((UVar5 == 'C') && (UVar5 = TreeModel::subtype(this->model,&index), UVar5 == '\x18')) {
            local_118._16_8_ = local_e8.d.field_2._M_allocated_capacity;
            local_118._0_8_ = local_e8.d._M_dataplus._M_p;
            local_118._8_8_ = local_e8.d._M_string_length;
            local_118._24_8_ = CONCAT44(index.c,index.r);
            uStack_f8 = index.i;
            pTStack_f0 = index.m;
            std::
            _Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
            ::_M_insert_unique<std::pair<UModelIndex,UModelIndex>>
                      ((_Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
                        *)files,(pair<UModelIndex,_UModelIndex> *)local_118);
          }
          else {
            uStack_f8 = 0;
            pTStack_f0 = (TreeModel *)0x0;
            local_118._0_8_ = local_e8.d._M_dataplus._M_p;
            local_118._8_8_ = local_e8.d._M_string_length;
            local_118._16_8_ = local_e8.d.field_2._M_allocated_capacity;
            local_118._24_8_ = 0xffffffffffffffff;
            std::
            _Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
            ::_M_insert_unique<std::pair<UModelIndex,UModelIndex>>
                      ((_Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
                        *)files,(pair<UModelIndex,_UModelIndex> *)local_118);
          }
        }
      }
    }
    else if (-1 < IVar9) goto LAB_0010c09b;
    if (local_c8 != local_b8) {
      operator_delete(local_c8);
    }
  }
  UVar12 = 0;
LAB_0010c191:
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (UINT8 *)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (UINT8 *)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return UVar12;
}

Assistant:

USTATUS UEFIFind::findFileRecursive(const UModelIndex index, const UString & hexPattern, const UINT8 mode, std::set<std::pair<UModelIndex, UModelIndex> > & files)
{
    if (!index.isValid())
        return U_SUCCESS;

    if (hexPattern.isEmpty())
        return U_INVALID_PARAMETER;

    const char *hexPatternRaw = hexPattern.toLocal8Bit();
    std::vector<UINT8> pattern, patternMask;
    if (!makePattern(hexPatternRaw, pattern, patternMask))
        return U_INVALID_PARAMETER;

    // Check for "all substrings" pattern
    size_t count = 0;
    for (size_t i = 0; i < patternMask.size(); i++)
        if (patternMask[i] == 0)
            count++;
    if (count == patternMask.size())
        return U_SUCCESS;

    bool hasChildren = (model->rowCount(index) > 0);
    for (int i = 0; i < model->rowCount(index); i++) {
        findFileRecursive(index.model()->index(i, index.column(), index), hexPattern, mode, files);
    }

    // TODO: handle a case where an item has both compressed and uncompressed bodies
    UByteArray data;
    if (hasChildren) {
        if (mode == SEARCH_MODE_HEADER)
            data = model->header(index);
        else if (mode == SEARCH_MODE_ALL)
            data = model->header(index) + model->body(index);
    }
    else {
        if (mode == SEARCH_MODE_HEADER)
            data = model->header(index);
        else if (mode == SEARCH_MODE_BODY)
            data = model->body(index);
        else
            data = model->header(index) + model->body(index);
    }

    const UINT8 *rawData = reinterpret_cast<const UINT8 *>(data.constData());
    INTN offset = findPattern(pattern.data(), patternMask.data(), pattern.size(), rawData, data.size(), 0);

    // For patterns that cross header|body boundary, skip patterns entirely located in body, since
    // children search above has already found them.
    if (hasChildren && mode == SEARCH_MODE_ALL && offset >= model->header(index).size()) {
        offset = -1;
    }

    if (offset >= 0) {
        if (model->type(index) != Types::File) {
            UModelIndex parentFile = model->findParentOfType(index, Types::File);
            if (model->type(index) == Types::Section && model->subtype(index) == EFI_SECTION_FREEFORM_SUBTYPE_GUID)
                files.insert(std::pair<UModelIndex, UModelIndex>(parentFile, index));
            else
                files.insert(std::pair<UModelIndex, UModelIndex>(parentFile, UModelIndex()));
        }
        else {
            files.insert(std::pair<UModelIndex, UModelIndex>(index, UModelIndex()));
        }
    }

    return U_SUCCESS;
}